

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_sem.c
# Opt level: O0

QcSem * qc_sem_open(char *name,QcErr *err)

{
  size_t sVar1;
  sem_t *psVar2;
  QcSem *qcSem;
  sem_t *sem;
  int flags;
  QcErr *err_local;
  char *name_local;
  
  sVar1 = strlen(name);
  if (sVar1 < 0x81) {
    psVar2 = sem_open(name,0);
    if (psVar2 == (sem_t *)0x0) {
      qc_seterr(err,-1,"open sem (name : %s) failed.",name);
      name_local = (char *)0x0;
    }
    else {
      name_local = (char *)malloc(0x98);
      if (name_local == (char *)0x0) {
        fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_sem.c"
                ,0x6f);
        __assert_fail("qcSem",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_sem.c"
                      ,0x6f,"QcSem *qc_sem_open(const char *, QcErr *)");
      }
      memset(name_local,0,0x98);
      *(sem_t **)(name_local + 0x88) = psVar2;
      strncpy(name_local,name,0x80);
      name_local[0x90] = '\0';
      name_local[0x91] = '\0';
      name_local[0x92] = '\0';
      name_local[0x93] = '\0';
    }
  }
  else {
    qc_seterr(err,-1,"parameter name (%s) is too long.",name);
    name_local = (char *)0x0;
  }
  return (QcSem *)name_local;
}

Assistant:

QcSem* qc_sem_open(const char *name, QcErr *err)
{
    int flags;
    sem_t *sem;

    flags = 0;  //just open

	if (strlen(name) > QC_SEMNAME_MAXLEN)
	{
		qc_seterr(err, -1, "parameter name (%s) is too long.", name);
		return NULL;
	}

    sem = sem_open(name, flags);
    if(NULL == sem)
    {
        qc_seterr(err, -1, "open sem (name : %s) failed.", name);
        return NULL;
    }

    QcSem *qcSem;

    qc_malloc(qcSem, sizeof(QcSem));
    qcSem->sem = sem;
    strncpy(qcSem->name, name, QC_SEMNAME_MAXLEN);
    qcSem->flags = flags;

    return qcSem;
}